

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

int __thiscall leveldb::VersionSet::NumLevelFiles(VersionSet *this,int level)

{
  size_type sVar1;
  int level_local;
  VersionSet *this_local;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x45c,"int leveldb::VersionSet::NumLevelFiles(int) const");
  }
  if (level < 7) {
    sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (this->current_->files_ + level);
    return (int)sVar1;
  }
  __assert_fail("level < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                ,0x45d,"int leveldb::VersionSet::NumLevelFiles(int) const");
}

Assistant:

int VersionSet::NumLevelFiles(int level) const {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  return current_->files_[level].size();
}